

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CoreMLModels::WordTagger::_InternalParse
          (WordTagger *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  internal *this_01;
  size_t size;
  ulong uVar2;
  bool bVar3;
  string *psVar4;
  StringVector *msg;
  uint uVar5;
  char *field_name;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  ArenaStringPtr *pAVar7;
  Arena *arena;
  char cVar8;
  uint uVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  StringPiece str;
  byte *local_68;
  ArenaStringPtr *local_60;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_68 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_68,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->modelparameterdata_;
    local_40 = &this->tokenlengthsoutputfeaturename_;
    local_48 = &this->tokenlocationsoutputfeaturename_;
    local_50 = &this->tokentagsoutputfeaturename_;
    local_58 = &this->tokensoutputfeaturename_;
    local_60 = &this->language_;
    do {
      bVar1 = *local_68;
      uVar9 = (uint)bVar1;
      p = local_68 + 1;
      if ((char)bVar1 < '\0') {
        uVar9 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_68,uVar9);
          p = (byte *)pVar10.first;
          uVar9 = pVar10.second;
        }
        else {
          p = local_68 + 2;
        }
      }
      uVar5 = uVar9 >> 3;
      field_name = (char *)(ulong)uVar5;
      cVar8 = (char)uVar9;
      local_68 = p;
      if (uVar5 < 0x14) {
        if (uVar5 != 1) {
          if ((uVar5 == 10) && (cVar8 == 'R')) {
            puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
            pAVar7 = local_60;
            if ((this_00->ptr_ & 1U) != 0) {
              puVar6 = (undefined8 *)*puVar6;
            }
            goto LAB_002cc7d0;
          }
LAB_002cc854:
          if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
            if (p == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
            return (char *)p;
          }
          if ((this_00->ptr_ & 1U) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_68 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar9,unknown,(char *)local_68,ctx);
          goto joined_r0x002cc816;
        }
        if (cVar8 != '\b') goto LAB_002cc854;
        bVar1 = *p;
        uVar9 = (uint)bVar1;
        local_68 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar9 = ((uint)bVar1 + (uint)*local_68 * 0x80) - 0x80;
          if ((char)*local_68 < '\0') {
            local_68 = p;
            pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar9);
            local_68 = (byte *)pVar10.first;
            this->revision_ = pVar10.second;
            goto joined_r0x002cc816;
          }
          local_68 = p + 2;
        }
        this->revision_ = uVar9;
      }
      else {
        if (uVar5 - 0x14 < 4) {
          field_name = (char *)((long)&switchD_002cc698::switchdataD_003b57d8 +
                               (long)(int)(&switchD_002cc698::switchdataD_003b57d8)[uVar5 - 0x14]);
          switch(uVar5) {
          case 0x14:
            if (cVar8 == -0x5e) {
              puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
              pAVar7 = local_58;
              if ((this_00->ptr_ & 1U) != 0) {
                puVar6 = (undefined8 *)*puVar6;
              }
LAB_002cc7d0:
              psVar4 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar7,puVar6)
              ;
              local_68 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                           (psVar4,(char *)local_68,ctx);
              this_01 = (internal *)(psVar4->_M_dataplus)._M_p;
              size = psVar4->_M_string_length;
              if ((long)size < 0) {
                google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          (size,"string length exceeds max size");
              }
              str.length_ = 0;
              str.ptr_ = (char *)size;
              bVar3 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
              if (!bVar3) {
                return (char *)0x0;
              }
              goto joined_r0x002cc816;
            }
            break;
          case 0x15:
            if (cVar8 == -0x56) {
              puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
              pAVar7 = local_50;
              if ((this_00->ptr_ & 1U) != 0) {
                puVar6 = (undefined8 *)*puVar6;
              }
              goto LAB_002cc7d0;
            }
            break;
          case 0x16:
            if (cVar8 == -0x4e) {
              puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
              pAVar7 = local_48;
              if ((this_00->ptr_ & 1U) != 0) {
                puVar6 = (undefined8 *)*puVar6;
              }
              goto LAB_002cc7d0;
            }
            break;
          case 0x17:
            if (cVar8 == -0x46) {
              puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
              pAVar7 = local_40;
              if ((this_00->ptr_ & 1U) != 0) {
                puVar6 = (undefined8 *)*puVar6;
              }
              goto LAB_002cc7d0;
            }
          }
          goto LAB_002cc854;
        }
        if (uVar5 == 100) {
          if (cVar8 != '\"') goto LAB_002cc854;
          puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            puVar6 = (undefined8 *)*puVar6;
          }
          psVar4 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar6);
          local_68 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar4,(char *)local_68,ctx);
        }
        else {
          if ((uVar5 != 200) || (cVar8 != 'B')) goto LAB_002cc854;
          if (this->_oneof_case_[0] == 200) {
            msg = (this->Tags_).stringtags_;
          }
          else {
            clear_Tags(this);
            this->_oneof_case_[0] = 200;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              arena = *(Arena **)arena;
            }
            msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                            (arena);
            (this->Tags_).stringtags_ = msg;
          }
          local_68 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_68);
        }
joined_r0x002cc816:
        if (local_68 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_68,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_68;
}

Assistant:

const char* WordTagger::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 revision = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          revision_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string language = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_language();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokensOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_tokensoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenTagsOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_tokentagsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenLocationsOutputFeatureName = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 178)) {
          auto str = _internal_mutable_tokenlocationsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenLengthsOutputFeatureName = 23;
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          auto str = _internal_mutable_tokenlengthsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes modelParameterData = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_modelparameterdata();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringTags = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringtags(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}